

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::js::Generator::FindRequiresForMessage
          (Generator *this,GeneratorOptions *options,Descriptor *desc,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *required,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *forwards,bool *have_message)

{
  bool bVar1;
  FieldDescriptor *pFVar2;
  long lVar3;
  FieldDescriptor *pFVar4;
  int i;
  long lVar5;
  
  *have_message = true;
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(desc + 4); lVar5 = lVar5 + 1) {
    pFVar2 = (FieldDescriptor *)(*(long *)(desc + 0x28) + lVar3);
    pFVar4 = pFVar2;
    bVar1 = anon_unknown_0::IgnoreField(pFVar2);
    if (!bVar1) {
      FindRequiresForField((Generator *)pFVar4,options,pFVar2,required,forwards);
    }
    lVar3 = lVar3 + 0x48;
  }
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(desc + 0x7c); lVar5 = lVar5 + 1) {
    pFVar2 = (FieldDescriptor *)(*(long *)(desc + 0x50) + lVar3);
    pFVar4 = pFVar2;
    bVar1 = anon_unknown_0::IgnoreField(pFVar2);
    if (!bVar1) {
      FindRequiresForExtension((Generator *)pFVar4,options,pFVar2,required,forwards);
    }
    lVar3 = lVar3 + 0x48;
  }
  lVar3 = 0;
  for (lVar5 = 0; lVar5 < *(int *)(desc + 0x70); lVar5 = lVar5 + 1) {
    FindRequiresForMessage
              (this,options,(Descriptor *)(*(long *)(desc + 0x38) + lVar3),required,forwards,
               have_message);
    lVar3 = lVar3 + 0x88;
  }
  return;
}

Assistant:

void Generator::FindRequiresForMessage(const GeneratorOptions& options,
                                       const Descriptor* desc,
                                       std::set<std::string>* required,
                                       std::set<std::string>* forwards,
                                       bool* have_message) const {
  if (!NamespaceOnly(desc)) {
    *have_message = true;
    for (int i = 0; i < desc->field_count(); i++) {
      const FieldDescriptor* field = desc->field(i);
      if (IgnoreField(field)) {
        continue;
      }
      FindRequiresForField(options, field, required, forwards);
    }
  }

  for (int i = 0; i < desc->extension_count(); i++) {
    const FieldDescriptor* field = desc->extension(i);
    if (IgnoreField(field)) {
      continue;
    }
    FindRequiresForExtension(options, field, required, forwards);
  }

  for (int i = 0; i < desc->nested_type_count(); i++) {
    FindRequiresForMessage(options, desc->nested_type(i), required, forwards,
                           have_message);
  }
}